

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

uint64 __thiscall
xLearn::Parser::get_line_from_buffer(Parser *this,char *line,char *buf,uint64 pos,uint64 size)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar4;
  allocator local_6e;
  allocator local_6d;
  Logger local_6c;
  string local_68;
  string local_48;
  uint64 uVar3;
  
  uVar4 = pos;
  if (pos < size) {
    for (; (uVar3 = size, uVar4 < size && (uVar3 = uVar4, buf[uVar4] != '\n')); uVar4 = uVar4 + 1) {
    }
    lVar2 = uVar3 - pos;
    uVar4 = lVar2 + 1;
    if (0xa00000 < uVar4) {
      local_6c.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
                 ,&local_6d);
      std::__cxx11::string::string((string *)&local_68,"get_line_from_buffer",&local_6e);
      poVar1 = Logger::Start(FATAL,&local_48,0x34,&local_68);
      std::operator<<(poVar1,
                      "Encountered a too-long line.                       Please check the data.");
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      Logger::~Logger(&local_6c);
    }
    memcpy(line,buf + pos,uVar4);
    line[lVar2] = '\0';
    if ((1 < uVar4) && (line[lVar2 + -1] == '\r')) {
      line[lVar2 + -1] = '\0';
    }
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint64 Parser::get_line_from_buffer(char* line,
                                    char* buf,
                                    uint64 pos,
                                    uint64 size) {
  if (pos >= size) { return 0; }
  uint64 end_pos = pos;
  while (end_pos < size && buf[end_pos] != '\n') { end_pos++; }
  uint64 read_size = end_pos - pos + 1;
  if (read_size > kMaxLineSize) {
    LOG(FATAL) << "Encountered a too-long line.    \
                   Please check the data.";
  }
  memcpy(line, buf+pos, read_size);
  line[read_size - 1] = '\0';
  if (read_size > 1 && line[read_size - 2] == '\r') {
    // Handle some txt format in windows or DOS.
    line[read_size - 2] = '\0';
  }
  return read_size;
}